

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O0

void __thiscall
Centaurus::ChaserEM64T<unsigned_char>::emit_machine
          (ChaserEM64T<unsigned_char> *this,X86Assembler *as,Grammar<unsigned_char> *grammar,
          Identifier *id,CompositeATN<unsigned_char> *catn,Label *rejectlabel,MyConstPool *pool)

{
  pointer pLVar1;
  int iVar2;
  int iVar3;
  ATNNodeType AVar4;
  ATNMachine<unsigned_char> *this_00;
  reference pvVar5;
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_> *str;
  NFA<unsigned_char> *nfa;
  Identifier *id_00;
  vector<Centaurus::ATNTransition<unsigned_char>,_std::allocator<Centaurus::ATNTransition<unsigned_char>_>_>
  *this_01;
  size_type sVar6;
  ATNTransition<unsigned_char> *pAVar7;
  X86Assembler *in_stack_fffffffffffff958;
  CodeEmitter *in_stack_fffffffffffff960;
  CompositeATN<unsigned_char> *in_stack_fffffffffffff968;
  uint32_t instId;
  CodeEmitter *in_stack_fffffffffffff970;
  ATNPath local_5a8;
  ATNPath local_588;
  LookaheadDFA<unsigned_char> local_568;
  int local_544;
  undefined1 local_540 [4];
  int j;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> exitlabels;
  undefined1 auStack_520 [4];
  int outbound_num;
  undefined8 uStack_518;
  anon_union_16_7_ed616b9d_for_Operand__0 local_510;
  anon_union_16_7_ed616b9d_for_Operand__0 local_500;
  anon_union_16_7_ed616b9d_for_Operand__0 local_4f0;
  anon_union_16_7_ed616b9d_for_Operand__0 local_4e0;
  DFA<unsigned_char> local_4d0;
  anon_union_16_7_ed616b9d_for_Operand__0 local_4b0;
  anon_union_16_7_ed616b9d_for_Operand__0 local_4a0;
  anon_union_16_7_ed616b9d_for_Operand__0 local_490;
  ATNNode<unsigned_char> *local_480;
  ATNNode<unsigned_char> *node;
  undefined1 local_470 [4];
  int i_1;
  Label finishlabel;
  int local_450;
  int i;
  ATNMachine<unsigned_char> *machine;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> statelabels;
  Label *rejectlabel_local;
  CompositeATN<unsigned_char> *catn_local;
  Identifier *id_local;
  Grammar<unsigned_char> *grammar_local;
  X86Assembler *as_local;
  ChaserEM64T<unsigned_char> *this_local;
  
  statelabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = rejectlabel;
  std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::vector
            ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)&machine);
  this_00 = Grammar<unsigned_char>::operator[](grammar,id);
  for (local_450 = 0; iVar2 = ATNMachine<unsigned_char>::get_node_num(this_00), local_450 < iVar2;
      local_450 = local_450 + 1) {
    (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[7])
              ((undefined1 *)((long)&finishlabel.super_Operand.super_Operand_.field_0 + 8));
    std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::push_back
              ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)&machine,
               (value_type *)((long)&finishlabel.super_Operand.super_Operand_.field_0 + 8));
  }
  (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[7])(local_470);
  for (node._4_4_ = 0; iVar2 = node._4_4_, iVar3 = ATNMachine<unsigned_char>::get_node_num(this_00),
      iVar2 < iVar3; node._4_4_ = node._4_4_ + 1) {
    pvVar5 = std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::operator[]
                       ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)&machine,
                        (long)node._4_4_);
    (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[9])(as,pvVar5);
    local_480 = ATNMachine<unsigned_char>::get_node(this_00,node._4_4_);
    AVar4 = ATNNode<unsigned_char>::type(local_480);
    instId = (uint32_t)((ulong)in_stack_fffffffffffff968 >> 0x20);
    switch(AVar4) {
    case Blank:
      break;
    case Nonterminal:
      asmjit::CodeEmitter::emit
                (in_stack_fffffffffffff960,(uint32_t)((ulong)in_stack_fffffffffffff958 >> 0x20),
                 (Operand_ *)0x18e587);
      asmjit::CodeEmitter::emit
                (in_stack_fffffffffffff960,(uint32_t)((ulong)in_stack_fffffffffffff958 >> 0x20),
                 (Operand_ *)0x18e5c5);
      local_510._packed[0] = (UInt64)0x808000031;
      local_510._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)0;
      id_00 = ATNNode<unsigned_char>::get_invoke(local_480);
      iVar2 = Grammar<unsigned_char>::get_machine_id(grammar,id_00);
      _auStack_520 = 0x608000031;
      uStack_518 = 0;
      call_abs<void_const*(*)(void*,int,void_const*),asmjit::X86Gp,int,asmjit::X86Gp>
                (as,request_nonterminal,(X86Gp *)&local_510._any,iVar2,(X86Gp *)auStack_520);
      asmjit::CodeEmitter::emit
                (in_stack_fffffffffffff960,(uint32_t)((ulong)in_stack_fffffffffffff958 >> 0x20),
                 (Operand_ *)0x18e7a9);
      asmjit::CodeEmitter::emit
                (in_stack_fffffffffffff960,(uint32_t)((ulong)in_stack_fffffffffffff958 >> 0x20),
                 (Operand_ *)0x18e7e7);
      asmjit::CodeEmitter::emit
                (in_stack_fffffffffffff970,(uint32_t)((ulong)in_stack_fffffffffffff968 >> 0x20),
                 (Operand_ *)in_stack_fffffffffffff960,(Operand_ *)in_stack_fffffffffffff958);
      break;
    case LiteralTerminal:
      asmjit::CodeEmitter::emit
                (in_stack_fffffffffffff970,instId,(Operand_ *)in_stack_fffffffffffff960,
                 (Operand_ *)in_stack_fffffffffffff958);
      pLVar1 = statelabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage;
      str = ATNNode<unsigned_char>::get_literal_abi_cxx11_(local_480);
      MatchRoutineEM64T<unsigned_char>::emit(as,pool,pLVar1,str);
      iVar2 = ATNNode<unsigned_char>::get_id(local_480);
      if (-1 < iVar2) {
        asmjit::CodeEmitter::emit
                  (in_stack_fffffffffffff960,(uint32_t)((ulong)in_stack_fffffffffffff958 >> 0x20),
                   (Operand_ *)0x18dd41);
        asmjit::CodeEmitter::emit
                  (in_stack_fffffffffffff960,(uint32_t)((ulong)in_stack_fffffffffffff958 >> 0x20),
                   (Operand_ *)0x18dd7f);
        asmjit::CodeEmitter::emit
                  (in_stack_fffffffffffff960,(uint32_t)((ulong)in_stack_fffffffffffff958 >> 0x20),
                   (Operand_ *)0x18ddbd);
        local_490._packed[0] = (UInt64)0x808000031;
        local_490._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)0;
        iVar2 = ATNNode<unsigned_char>::get_id(local_480);
        local_4a0._packed[0] = (UInt64)0x708000031;
        local_4a0._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)0;
        local_4b0._packed[0] = (UInt64)0x608000031;
        local_4b0._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)0;
        call_abs<void(*)(void*,int,void_const*,void_const*),asmjit::X86Gp,int,asmjit::X86Gp,asmjit::X86Gp>
                  (as,push_terminal,(X86Gp *)&local_490._any,iVar2,(X86Gp *)&local_4a0._any,
                   (X86Gp *)&local_4b0._any);
        asmjit::CodeEmitter::emit
                  (in_stack_fffffffffffff960,(uint32_t)((ulong)in_stack_fffffffffffff958 >> 0x20),
                   (Operand_ *)0x18e010);
        asmjit::CodeEmitter::emit
                  (in_stack_fffffffffffff960,(uint32_t)((ulong)in_stack_fffffffffffff958 >> 0x20),
                   (Operand_ *)0x18e04e);
        asmjit::CodeEmitter::emit
                  (in_stack_fffffffffffff960,(uint32_t)((ulong)in_stack_fffffffffffff958 >> 0x20),
                   (Operand_ *)0x18e08c);
      }
      break;
    case RegularTerminal:
      asmjit::CodeEmitter::emit
                (in_stack_fffffffffffff970,instId,(Operand_ *)in_stack_fffffffffffff960,
                 (Operand_ *)in_stack_fffffffffffff958);
      pLVar1 = statelabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage;
      nfa = ATNNode<unsigned_char>::get_nfa(local_480);
      DFA<unsigned_char>::DFA(&local_4d0,nfa,true);
      DFARoutineEM64T<unsigned_char>::emit(as,pLVar1,&local_4d0,pool);
      DFA<unsigned_char>::~DFA(&local_4d0);
      iVar2 = ATNNode<unsigned_char>::get_id(local_480);
      if (-1 < iVar2) {
        asmjit::CodeEmitter::emit
                  (in_stack_fffffffffffff960,(uint32_t)((ulong)in_stack_fffffffffffff958 >> 0x20),
                   (Operand_ *)0x18e1c1);
        asmjit::CodeEmitter::emit
                  (in_stack_fffffffffffff960,(uint32_t)((ulong)in_stack_fffffffffffff958 >> 0x20),
                   (Operand_ *)0x18e1ff);
        asmjit::CodeEmitter::emit
                  (in_stack_fffffffffffff960,(uint32_t)((ulong)in_stack_fffffffffffff958 >> 0x20),
                   (Operand_ *)0x18e23d);
        local_4e0._packed[0] = (UInt64)0x808000031;
        local_4e0._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)0;
        iVar2 = ATNNode<unsigned_char>::get_id(local_480);
        local_4f0._packed[0] = (UInt64)0x708000031;
        local_4f0._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)0;
        local_500._packed[0] = (UInt64)0x608000031;
        local_500._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)0;
        call_abs<void(*)(void*,int,void_const*,void_const*),asmjit::X86Gp,int,asmjit::X86Gp,asmjit::X86Gp>
                  (as,push_terminal,(X86Gp *)&local_4e0._any,iVar2,(X86Gp *)&local_4f0._any,
                   (X86Gp *)&local_500._any);
        asmjit::CodeEmitter::emit
                  (in_stack_fffffffffffff960,(uint32_t)((ulong)in_stack_fffffffffffff958 >> 0x20),
                   (Operand_ *)0x18e490);
        asmjit::CodeEmitter::emit
                  (in_stack_fffffffffffff960,(uint32_t)((ulong)in_stack_fffffffffffff958 >> 0x20),
                   (Operand_ *)0x18e4ce);
        asmjit::CodeEmitter::emit
                  (in_stack_fffffffffffff960,(uint32_t)((ulong)in_stack_fffffffffffff958 >> 0x20),
                   (Operand_ *)0x18e50c);
      }
      break;
    case WhiteSpace:
      SkipRoutineEM64T<unsigned_char>::emit(as);
    }
    this_01 = ATNNode<unsigned_char>::get_transitions(local_480);
    sVar6 = std::
            vector<Centaurus::ATNTransition<unsigned_char>,_std::allocator<Centaurus::ATNTransition<unsigned_char>_>_>
            ::size(this_01);
    exitlabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = (int)sVar6;
    if (exitlabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
      asmjit::CodeEmitter::emit
                (in_stack_fffffffffffff960,(uint32_t)((ulong)in_stack_fffffffffffff958 >> 0x20),
                 (Operand_ *)0x18e8a7);
    }
    else if (exitlabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ == 1) {
      pAVar7 = ATNNode<unsigned_char>::get_transition(local_480,0);
      iVar2 = ATNTransition<unsigned_char>::dest(pAVar7);
      std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::operator[]
                ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)&machine,(long)iVar2);
      asmjit::CodeEmitter::emit
                (in_stack_fffffffffffff960,(uint32_t)((ulong)in_stack_fffffffffffff958 >> 0x20),
                 (Operand_ *)0x18e938);
    }
    else {
      std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::vector
                ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)local_540);
      for (local_544 = 0;
          local_544 <
          exitlabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_; local_544 = local_544 + 1) {
        pAVar7 = ATNNode<unsigned_char>::get_transition(local_480,local_544);
        iVar2 = ATNTransition<unsigned_char>::dest(pAVar7);
        pvVar5 = std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::operator[]
                           ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)&machine,
                            (long)iVar2);
        std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::push_back
                  ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)local_540,pvVar5);
      }
      in_stack_fffffffffffff958 = as;
      in_stack_fffffffffffff960 =
           (CodeEmitter *)
           statelabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      in_stack_fffffffffffff968 = catn;
      in_stack_fffffffffffff970 = (CodeEmitter *)catn;
      ATNPath::ATNPath(&local_5a8,id,node._4_4_);
      CompositeATN<unsigned_char>::convert_atn_path(&local_588,in_stack_fffffffffffff968,&local_5a8)
      ;
      LookaheadDFA<unsigned_char>::LookaheadDFA
                (&local_568,(CompositeATN<unsigned_char> *)in_stack_fffffffffffff970,&local_588,true
                );
      LDFARoutineEM64T<unsigned_char>::emit
                (in_stack_fffffffffffff958,(Label *)in_stack_fffffffffffff960,&local_568,
                 (vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)local_540);
      LookaheadDFA<unsigned_char>::~LookaheadDFA(&local_568);
      ATNPath::~ATNPath(&local_588);
      ATNPath::~ATNPath(&local_5a8);
      std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::~vector
                ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)local_540);
    }
  }
  (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[9])(as,local_470);
  std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::~vector
            ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)&machine);
  return;
}

Assistant:

void ChaserEM64T<TCHAR>::emit_machine(asmjit::X86Assembler& as, const Grammar<TCHAR>& grammar, const Identifier& id, const CompositeATN<TCHAR>& catn, asmjit::Label& rejectlabel, MyConstPool& pool)
{
	std::vector<asmjit::Label> statelabels;

    const ATNMachine<TCHAR>& machine = grammar[id];

	for (int i = 0; i < machine.get_node_num(); i++)
	{
		statelabels.push_back(as.newLabel());
	}

    asmjit::Label finishlabel = as.newLabel();

	for (int i = 0; i < machine.get_node_num(); i++)
	{
		as.bind(statelabels[i]);

		const ATNNode<TCHAR>& node = machine.get_node(i);

		switch (node.type())
		{
		case ATNNodeType::Blank:
			break;
		case ATNNodeType::LiteralTerminal:
			as.mov(CHECKPOINT_REG, INPUT_REG);
			MatchRoutineEM64T<TCHAR>::emit(as, pool, rejectlabel, node.get_literal());
            if (node.get_id() >= 0)
            {
                as.push(INPUT_REG);
                as.push(CONTEXT_REG);
				as.push(STACK_BACKUP_REG);
                call_abs(as, push_terminal, CONTEXT_REG, node.get_id(), CHECKPOINT_REG, INPUT_REG);
				as.pop(STACK_BACKUP_REG);
				as.pop(CONTEXT_REG);
                as.pop(INPUT_REG);
            }
            break;
		case ATNNodeType::RegularTerminal:
            as.mov(CHECKPOINT_REG, INPUT_REG);
			DFARoutineEM64T<TCHAR>::emit(as, rejectlabel, DFA<TCHAR>(node.get_nfa()), pool);
            if (node.get_id() >= 0)
            {
                as.push(INPUT_REG);
                as.push(CONTEXT_REG);
				as.push(STACK_BACKUP_REG);
				call_abs(as, push_terminal, CONTEXT_REG, node.get_id(), CHECKPOINT_REG, INPUT_REG);
				as.pop(STACK_BACKUP_REG);
				as.pop(CONTEXT_REG);
                as.pop(INPUT_REG);
            }
            break;
		case ATNNodeType::WhiteSpace:
			SkipRoutineEM64T<TCHAR>::emit(as);
			break;
		case ATNNodeType::Nonterminal:
            as.push(CONTEXT_REG);
			as.push(STACK_BACKUP_REG);
            call_abs(as, request_nonterminal, CONTEXT_REG, grammar.get_machine_id(node.get_invoke()), INPUT_REG);
			as.pop(STACK_BACKUP_REG);
			as.pop(CONTEXT_REG);
            as.mov(INPUT_REG, asmjit::x86::rax);
			break;
		}

		int outbound_num = node.get_transitions().size();
		if (outbound_num == 0)
		{
			as.jmp(finishlabel);
		}
		else if (outbound_num == 1)
		{
			as.jmp(statelabels[node.get_transition(0).dest()]);
		}
		else
		{
			std::vector<asmjit::Label> exitlabels;

			for (int j = 0; j < outbound_num; j++)
			{
				exitlabels.push_back(statelabels[node.get_transition(j).dest()]);
			}

			LDFARoutineEM64T<TCHAR>::emit(as, rejectlabel, LookaheadDFA<TCHAR>(catn, catn.convert_atn_path(ATNPath(id, i))), exitlabels);
		}
	}
    as.bind(finishlabel);
}